

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQClassMember>::resize
          (sqvector<SQClassMember> *this,SQUnsignedInteger newsize,SQClassMember *fill)

{
  SQClassMember *in_RDX;
  SQClassMember *in_RSI;
  long in_RDI;
  SQUnsignedInteger i;
  SQClassMember *pSVar1;
  
  if (*(SQClassMember **)(in_RDI + 0x10) < in_RSI) {
    _realloc((sqvector<SQClassMember> *)in_RSI,(SQUnsignedInteger)in_RDX);
  }
  pSVar1 = in_RSI;
  if (*(SQClassMember **)(in_RDI + 8) < in_RSI) {
    while (*(SQClassMember **)(in_RDI + 8) < in_RSI) {
      SQClassMember::SQClassMember(in_RSI,in_RDX);
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    }
  }
  else {
    for (; in_RSI < *(SQClassMember **)(in_RDI + 8);
        in_RSI = (SQClassMember *)((long)&(in_RSI->val).super_SQObject._type + 1)) {
      SQClassMember::~SQClassMember(in_RSI);
    }
    *(SQClassMember **)(in_RDI + 8) = pSVar1;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }